

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

int testEncHandler(xmlCharEncodingHandlerPtr handler,xmlChar *dec,int decSize,xmlChar *enc,
                  int encSize)

{
  int iVar1;
  xmlBufferPtr got;
  xmlBufferPtr got_00;
  int local_44;
  int ret;
  xmlBufferPtr decBuf;
  xmlBufferPtr encBuf;
  int encSize_local;
  xmlChar *enc_local;
  int decSize_local;
  xmlChar *dec_local;
  xmlCharEncodingHandlerPtr handler_local;
  
  got = (xmlBufferPtr)xmlBufferCreate();
  got_00 = (xmlBufferPtr)xmlBufferCreate();
  local_44 = 0;
  xmlBufferAdd(got,enc,encSize);
  xmlCharEncInFunc(handler,got_00,got);
  iVar1 = bufCompare(got_00,dec,decSize);
  if (iVar1 != 0) {
    fprintf(_stderr,"Decoding %s failed\n",handler->name);
    local_44 = -1;
  }
  xmlBufferEmpty(got_00);
  xmlBufferAdd(got_00,dec,decSize);
  xmlCharEncOutFunc(handler,got,got_00);
  iVar1 = bufCompare(got,enc,encSize);
  if (iVar1 != 0) {
    fprintf(_stderr,"Encoding %s failed\n",handler->name);
    local_44 = -1;
  }
  xmlBufferFree(got_00);
  xmlBufferFree(got);
  return local_44;
}

Assistant:

static int
testEncHandler(xmlCharEncodingHandlerPtr handler, const xmlChar *dec,
                int decSize, const xmlChar *enc, int encSize) {
    xmlBufferPtr encBuf = xmlBufferCreate();
    xmlBufferPtr decBuf = xmlBufferCreate();
    int ret = 0;

    xmlBufferAdd(encBuf, enc, encSize);
    xmlCharEncInFunc(handler, decBuf, encBuf);
    if (bufCompare(decBuf, dec, decSize) != 0) {
        fprintf(stderr, "Decoding %s failed\n", handler->name);
        ret = -1;
    }

#ifdef LIBXML_OUTPUT_ENABLED
    xmlBufferEmpty(decBuf);
    xmlBufferAdd(decBuf, dec, decSize);
    xmlCharEncOutFunc(handler, encBuf, decBuf);
    if (bufCompare(encBuf, enc, encSize) != 0) {
        fprintf(stderr, "Encoding %s failed\n", handler->name);
        ret = -1;
    }
#endif

    xmlBufferFree(decBuf);
    xmlBufferFree(encBuf);
    return(ret);
}